

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

Value * __thiscall Json::Value::operator=(Value *this,Value *other)

{
  ushort uVar1;
  ValueHolder VVar2;
  ValueHolder local_28;
  ushort local_20;
  
  Value((Value *)&local_28,other);
  uVar1 = *(ushort *)&this->field_0x8;
  VVar2 = this->value_;
  this->value_ = local_28;
  *(ushort *)&this->field_0x8 = local_20 & 0x1ff | uVar1 & 0xfe00;
  local_20 = uVar1 & 0x1ff | local_20 & 0xfe00;
  local_28 = VVar2;
  ~Value((Value *)&local_28);
  return this;
}

Assistant:

Value &
Value::operator=( const Value &other )
{
   Value temp( other );
   swap( temp );
   return *this;
}